

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expand_xz.c
# Opt level: O0

void test_expand_xz(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  int f;
  char *reffile;
  char *in_stack_00000018;
  undefined4 in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  char *in_stack_00000400;
  char *in_stack_00000498;
  wchar_t in_stack_000004a4;
  char *in_stack_000004a8;
  undefined4 in_stack_fffffffffffffff0;
  char *v1;
  
  v1 = "test_expand.xz";
  extract_reference_file(in_stack_00000400);
  wVar1 = systemf("%s %s >test.out 2>test.err",testprog,v1);
  if ((wVar1 != L'\0') && (wVar2 = canXz(), wVar2 == L'\0')) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_expand_xz.c"
                   ,L'(');
    test_skipping("It seems xz is not supported on this platform");
    return;
  }
  assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)v1,
                      (char *)CONCAT44(wVar1,in_stack_fffffffffffffff0),0,(char *)0x109c1c,
                      (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_text_file_contents(in_stack_00000028,in_stack_00000024,in_stack_00000018,reffile);
  assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
  return;
}

Assistant:

DEFINE_TEST(test_expand_xz)
{
	const char *reffile = "test_expand.xz";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canXz()) {
		assertEqualInt(0, f);
		assertTextFileContents("contents of test_expand.xz.\n", "test.out");
		assertEmptyFile("test.err");
	} else {
		skipping("It seems xz is not supported on this platform");
	}
}